

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ThreadSafeArena::AddCleanup
          (ThreadSafeArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  void *me;
  SerialArena *this_00;
  undefined8 *in_FS_OFFSET;
  bool bVar1;
  pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> pVar2;
  
  me = (void *)*in_FS_OFFSET;
  if (*(long *)((long)me + 8) == *(long *)this) {
    this_00 = *(SerialArena **)((long)me + 0x10);
    bVar1 = true;
  }
  else {
    this_00 = *(SerialArena **)(this + 0x18);
    if (this_00 == (SerialArena *)0x0) {
      bVar1 = false;
    }
    else {
      bVar1 = this_00->owner_ == me;
    }
  }
  if (!bVar1) {
    this_00 = GetSerialArenaFallback(this,me);
  }
  pVar2 = SerialArena::AllocateAlignedWithCleanup
                    (this_00,0,(AllocationPolicy *)(*(ulong *)(this + 8) & 0xfffffffffffffff8));
  (pVar2.second)->elem = elem;
  (pVar2.second)->cleanup = cleanup;
  return;
}

Assistant:

void ThreadSafeArena::AddCleanup(void* elem, void (*cleanup)(void*)) {
  SerialArena* arena;
  if (PROTOBUF_PREDICT_FALSE(!GetSerialArenaFast(&arena))) {
    arena = GetSerialArenaFallback(&thread_cache());
  }
  arena->AddCleanup(elem, cleanup, AllocPolicy());
}